

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_system.cpp
# Opt level: O2

int64_t __thiscall duckdb::FileSystem::GetFileSize(FileSystem *this,FileHandle *handle)

{
  NotImplementedException *this_00;
  allocator local_59;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string local_38;
  
  this_00 = (NotImplementedException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_38,"%s: GetFileSize is not implemented!",&local_59);
  (*this->_vptr_FileSystem[0x27])(&local_58,this);
  NotImplementedException::NotImplementedException<std::__cxx11::string>
            (this_00,&local_38,&local_58);
  __cxa_throw(this_00,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

int64_t FileSystem::GetFileSize(FileHandle &handle) {
	throw NotImplementedException("%s: GetFileSize is not implemented!", GetName());
}